

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O3

wchar_t lzx_make_huffman_table(huffman *hf)

{
  long lVar1;
  wchar_t wVar2;
  uchar *puVar3;
  uint16_t *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  wchar_t wVar13;
  byte bVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  wchar_t wVar18;
  ulong uVar19;
  uint16_t uVar20;
  long lVar21;
  uint16_t *puVar22;
  undefined1 auVar23 [16];
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar35;
  int iVar40;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int iVar41;
  int iVar43;
  undefined1 auVar42 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar46 [16];
  int aiStack_a8 [10];
  wchar_t bitptn [17];
  
  wVar13 = L'耀';
  uVar15 = 0;
  uVar19 = 0;
  iVar16 = 0;
  do {
    aiStack_a8[uVar15 + 1] = iVar16;
    bitptn[uVar15 + 0xb] = wVar13;
    lVar21 = uVar15 + 1;
    iVar16 = hf->freq[lVar21] * wVar13 + iVar16;
    uVar15 = uVar15 + 1;
    if (hf->freq[lVar21] != L'\0') {
      uVar19 = uVar15 & 0xffffffff;
    }
    wVar13 = (uint)wVar13 >> 1;
  } while (uVar15 != 0x10);
  wVar13 = L'\0';
  if ((short)iVar16 == 0) {
    wVar2 = hf->tbl_bits;
    wVar18 = (wchar_t)uVar19;
    if (wVar18 <= wVar2) {
      hf->max_bits = wVar18;
      if ((wVar18 < L'\x10') && (L'\0' < wVar18)) {
        bVar14 = 0x10 - (char)uVar19;
        uVar15 = 1;
        do {
          aiStack_a8[uVar15] = aiStack_a8[uVar15] >> (bVar14 & 0x1f);
          bitptn[uVar15 + 10] = bitptn[uVar15 + 10] >> (bVar14 & 0x1f);
          uVar15 = uVar15 + 1;
        } while ((uint)(wVar18 + L'\x01') != uVar15);
      }
      iVar16 = 1 << ((byte)wVar2 & 0x1f);
      puVar3 = hf->bitlen;
      puVar4 = hf->tbl;
      wVar13 = hf->len_size;
      hf->tree_used = L'\0';
      auVar12 = _DAT_0017fb00;
      auVar11 = _DAT_0017faf0;
      auVar10 = _DAT_0017fae0;
      auVar9 = _DAT_0017fab0;
      auVar8 = _DAT_0017faa0;
      if (0 < (long)wVar13) {
        lVar21 = 0;
        do {
          bVar14 = puVar3[lVar21];
          if (bVar14 != 0) {
            if (iVar16 < (int)(uint)bVar14) {
              return L'\0';
            }
            iVar35 = aiStack_a8[bVar14];
            wVar2 = bitptn[(ulong)bVar14 + 10];
            iVar17 = wVar2 + iVar35;
            aiStack_a8[bVar14] = iVar17;
            if (iVar16 < iVar17) {
              return L'\0';
            }
            if (L'\0' < wVar2) {
              lVar1 = (ulong)(uint)wVar2 - 1;
              auVar23._8_4_ = (int)lVar1;
              auVar23._0_8_ = lVar1;
              auVar23._12_4_ = (int)((ulong)lVar1 >> 0x20);
              puVar22 = puVar4 + (long)iVar35 + ((ulong)(uint)wVar2 - 1);
              auVar23 = auVar23 ^ auVar9;
              uVar15 = 0;
              do {
                auVar34._8_4_ = (int)uVar15;
                auVar34._0_8_ = uVar15;
                auVar34._12_4_ = (int)(uVar15 >> 0x20);
                auVar26 = (auVar34 | auVar8) ^ auVar9;
                iVar35 = auVar23._0_4_;
                iVar41 = -(uint)(iVar35 < auVar26._0_4_);
                iVar17 = auVar23._4_4_;
                auVar27._4_4_ = -(uint)(iVar17 < auVar26._4_4_);
                iVar40 = auVar23._8_4_;
                iVar43 = -(uint)(iVar40 < auVar26._8_4_);
                iVar24 = auVar23._12_4_;
                auVar27._12_4_ = -(uint)(iVar24 < auVar26._12_4_);
                auVar37._4_4_ = iVar41;
                auVar37._0_4_ = iVar41;
                auVar37._8_4_ = iVar43;
                auVar37._12_4_ = iVar43;
                auVar44 = pshuflw(in_XMM11,auVar37,0xe8);
                auVar29._4_4_ = -(uint)(auVar26._4_4_ == iVar17);
                auVar29._12_4_ = -(uint)(auVar26._12_4_ == iVar24);
                auVar29._0_4_ = auVar29._4_4_;
                auVar29._8_4_ = auVar29._12_4_;
                auVar46 = pshuflw(in_XMM12,auVar29,0xe8);
                auVar27._0_4_ = auVar27._4_4_;
                auVar27._8_4_ = auVar27._12_4_;
                auVar45 = pshuflw(auVar44,auVar27,0xe8);
                auVar26._8_4_ = 0xffffffff;
                auVar26._0_8_ = 0xffffffffffffffff;
                auVar26._12_4_ = 0xffffffff;
                auVar26 = (auVar45 | auVar46 & auVar44) ^ auVar26;
                auVar26 = packssdw(auVar26,auVar26);
                uVar20 = (uint16_t)lVar21;
                if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *puVar22 = uVar20;
                }
                auVar27 = auVar29 & auVar37 | auVar27;
                auVar26 = packssdw(auVar27,auVar27);
                auVar45._8_4_ = 0xffffffff;
                auVar45._0_8_ = 0xffffffffffffffff;
                auVar45._12_4_ = 0xffffffff;
                auVar26 = packssdw(auVar26 ^ auVar45,auVar26 ^ auVar45);
                if ((auVar26._0_4_ >> 0x10 & 1) != 0) {
                  puVar22[-1] = uVar20;
                }
                auVar26 = (auVar34 | auVar12) ^ auVar9;
                iVar41 = -(uint)(iVar35 < auVar26._0_4_);
                auVar42._4_4_ = -(uint)(iVar17 < auVar26._4_4_);
                iVar43 = -(uint)(iVar40 < auVar26._8_4_);
                auVar42._12_4_ = -(uint)(iVar24 < auVar26._12_4_);
                auVar28._4_4_ = iVar41;
                auVar28._0_4_ = iVar41;
                auVar28._8_4_ = iVar43;
                auVar28._12_4_ = iVar43;
                auVar36._4_4_ = -(uint)(auVar26._4_4_ == iVar17);
                auVar36._12_4_ = -(uint)(auVar26._12_4_ == iVar24);
                auVar36._0_4_ = auVar36._4_4_;
                auVar36._8_4_ = auVar36._12_4_;
                auVar42._0_4_ = auVar42._4_4_;
                auVar42._8_4_ = auVar42._12_4_;
                auVar26 = auVar36 & auVar28 | auVar42;
                auVar26 = packssdw(auVar26,auVar26);
                auVar5._8_4_ = 0xffffffff;
                auVar5._0_8_ = 0xffffffffffffffff;
                auVar5._12_4_ = 0xffffffff;
                auVar26 = packssdw(auVar26 ^ auVar5,auVar26 ^ auVar5);
                if ((auVar26 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  puVar22[-2] = uVar20;
                }
                auVar29 = pshufhw(auVar28,auVar28,0x84);
                auVar37 = pshufhw(auVar36,auVar36,0x84);
                auVar27 = pshufhw(auVar29,auVar42,0x84);
                auVar30._8_4_ = 0xffffffff;
                auVar30._0_8_ = 0xffffffffffffffff;
                auVar30._12_4_ = 0xffffffff;
                auVar30 = (auVar27 | auVar37 & auVar29) ^ auVar30;
                auVar29 = packssdw(auVar30,auVar30);
                if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  puVar22[-3] = uVar20;
                }
                auVar29 = (auVar34 | auVar11) ^ auVar9;
                iVar41 = -(uint)(iVar35 < auVar29._0_4_);
                auVar32._4_4_ = -(uint)(iVar17 < auVar29._4_4_);
                iVar43 = -(uint)(iVar40 < auVar29._8_4_);
                auVar32._12_4_ = -(uint)(iVar24 < auVar29._12_4_);
                auVar38._4_4_ = iVar41;
                auVar38._0_4_ = iVar41;
                auVar38._8_4_ = iVar43;
                auVar38._12_4_ = iVar43;
                auVar26 = pshuflw(auVar26,auVar38,0xe8);
                auVar31._4_4_ = -(uint)(auVar29._4_4_ == iVar17);
                auVar31._12_4_ = -(uint)(auVar29._12_4_ == iVar24);
                auVar31._0_4_ = auVar31._4_4_;
                auVar31._8_4_ = auVar31._12_4_;
                auVar29 = pshuflw(auVar46 & auVar44,auVar31,0xe8);
                in_XMM12 = auVar29 & auVar26;
                auVar32._0_4_ = auVar32._4_4_;
                auVar32._8_4_ = auVar32._12_4_;
                auVar26 = pshuflw(auVar26,auVar32,0xe8);
                auVar44._8_4_ = 0xffffffff;
                auVar44._0_8_ = 0xffffffffffffffff;
                auVar44._12_4_ = 0xffffffff;
                auVar44 = (auVar26 | in_XMM12) ^ auVar44;
                in_XMM11 = packssdw(auVar44,auVar44);
                if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  puVar22[-4] = uVar20;
                }
                auVar32 = auVar31 & auVar38 | auVar32;
                auVar26 = packssdw(auVar32,auVar32);
                auVar46._8_4_ = 0xffffffff;
                auVar46._0_8_ = 0xffffffffffffffff;
                auVar46._12_4_ = 0xffffffff;
                auVar26 = packssdw(auVar26 ^ auVar46,auVar26 ^ auVar46);
                if ((auVar26 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  puVar22[-5] = uVar20;
                }
                auVar26 = (auVar34 | auVar10) ^ auVar9;
                iVar35 = -(uint)(iVar35 < auVar26._0_4_);
                auVar39._4_4_ = -(uint)(iVar17 < auVar26._4_4_);
                iVar40 = -(uint)(iVar40 < auVar26._8_4_);
                auVar39._12_4_ = -(uint)(iVar24 < auVar26._12_4_);
                auVar33._4_4_ = iVar35;
                auVar33._0_4_ = iVar35;
                auVar33._8_4_ = iVar40;
                auVar33._12_4_ = iVar40;
                auVar25._4_4_ = -(uint)(auVar26._4_4_ == iVar17);
                auVar25._12_4_ = -(uint)(auVar26._12_4_ == iVar24);
                auVar25._0_4_ = auVar25._4_4_;
                auVar25._8_4_ = auVar25._12_4_;
                auVar39._0_4_ = auVar39._4_4_;
                auVar39._8_4_ = auVar39._12_4_;
                auVar26 = auVar25 & auVar33 | auVar39;
                auVar26 = packssdw(auVar26,auVar26);
                auVar6._8_4_ = 0xffffffff;
                auVar6._0_8_ = 0xffffffffffffffff;
                auVar6._12_4_ = 0xffffffff;
                auVar26 = packssdw(auVar26 ^ auVar6,auVar26 ^ auVar6);
                if ((auVar26 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  puVar22[-6] = uVar20;
                }
                auVar34 = pshufhw(auVar33,auVar33,0x84);
                auVar26 = pshufhw(auVar25,auVar25,0x84);
                auVar29 = pshufhw(auVar34,auVar39,0x84);
                auVar7._8_4_ = 0xffffffff;
                auVar7._0_8_ = 0xffffffffffffffff;
                auVar7._12_4_ = 0xffffffff;
                auVar26 = packssdw(auVar26 & auVar34,(auVar29 | auVar26 & auVar34) ^ auVar7);
                if ((auVar26 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  puVar22[-7] = uVar20;
                }
                uVar15 = uVar15 + 8;
                puVar22 = puVar22 + -8;
              } while ((uint)(wVar2 + L'\a' & 0xfffffff8) != uVar15);
            }
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 != wVar13);
      }
      wVar13 = L'\x01';
    }
  }
  return wVar13;
}

Assistant:

static int
lzx_make_huffman_table(struct huffman *hf)
{
	uint16_t *tbl;
	const unsigned char *bitlen;
	int bitptn[17], weight[17];
	int i, maxbits = 0, ptn, tbl_size, w;
	int len_avail;

	/*
	 * Initialize bit patterns.
	 */
	ptn = 0;
	for (i = 1, w = 1 << 15; i <= 16; i++, w >>= 1) {
		bitptn[i] = ptn;
		weight[i] = w;
		if (hf->freq[i]) {
			ptn += hf->freq[i] * w;
			maxbits = i;
		}
	}
	if ((ptn & 0xffff) != 0 || maxbits > hf->tbl_bits)
		return (0);/* Invalid */

	hf->max_bits = maxbits;

	/*
	 * Cut out extra bits which we won't house in the table.
	 * This preparation reduces the same calculation in the for-loop
	 * making the table.
	 */
	if (maxbits < 16) {
		int ebits = 16 - maxbits;
		for (i = 1; i <= maxbits; i++) {
			bitptn[i] >>= ebits;
			weight[i] >>= ebits;
		}
	}

	/*
	 * Make the table.
	 */
	tbl_size = 1 << hf->tbl_bits;
	tbl = hf->tbl;
	bitlen = hf->bitlen;
	len_avail = hf->len_size;
	hf->tree_used = 0;
	for (i = 0; i < len_avail; i++) {
		uint16_t *p;
		int len, cnt;

		if (bitlen[i] == 0)
			continue;
		/* Get a bit pattern */
		len = bitlen[i];
		if (len > tbl_size)
			return (0);
		ptn = bitptn[len];
		cnt = weight[len];
		/* Calculate next bit pattern */
		if ((bitptn[len] = ptn + cnt) > tbl_size)
			return (0);/* Invalid */
		/* Update the table */
		p = &(tbl[ptn]);
		while (--cnt >= 0)
			p[cnt] = (uint16_t)i;
	}
	return (1);
}